

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::IsVisibleToPlayer(AActor *this)

{
  long *plVar1;
  PClass *pPVar2;
  Node *pNVar3;
  undefined8 *puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar9;
  Node *pNVar10;
  undefined8 *puVar11;
  ulong uVar12;
  bool visible;
  
  lVar8 = (long)consoleplayer;
  if ((&DAT_017e5fc8)[lVar8 * 0x54] == 0) {
    return true;
  }
  if ((*(byte *)((&DAT_017e5fc8)[lVar8 * 0x54] + 0x20) & 0x20) != 0) {
    (&DAT_017e5fc8)[lVar8 * 0x54] = 0;
    return true;
  }
  if ((this->VisibleToTeam != 0) && (teamplay.Value)) {
    puVar4 = (undefined8 *)
             ((ulong)(((&DAT_017e5e98)[lVar8 * 0xa8] - 1 & 0x203) * 0x18) +
             (&DAT_017e5e88)[lVar8 * 0x54]);
    do {
      puVar11 = puVar4;
      puVar4 = (undefined8 *)*puVar11;
    } while (*(int *)(puVar11 + 1) != 0x203);
    if (this->VisibleToTeam - 1 != *(int *)(puVar11[2] + 0x28)) {
      return false;
    }
  }
  plVar1 = *(long **)((&DAT_017e5fc8)[lVar8 * 0x54] + 0x230);
  if (plVar1 == (long *)0x0) {
    return true;
  }
  if (*plVar1 == 0) {
    return true;
  }
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
  }
  if (*(int *)((long)&(this->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                      super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.Symbols
                      .LastFree + 4) == 0) {
    return true;
  }
  uVar12 = 0;
  bVar6 = false;
  do {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar7);
    }
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (*(uint *)((long)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.Symbols.Symbols.LastFree + 4) <= uVar12)
    break;
    if (pPVar2 == (PClass *)0x0) {
      iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar7);
    }
    pNVar3 = (&((this->super_DThinker).super_DObject.Class[1].super_PNativeStruct.super_PStruct.
                super_PNamedType.super_PCompoundType.super_PType.Symbols.Symbols.Nodes)->Next)
             [uVar12];
    if (pNVar3 == (Node *)0x0) {
LAB_00420168:
      bVar5 = true;
    }
    else {
      puVar4 = (undefined8 *)*plVar1;
      if (puVar4[1] == 0) {
        uVar9 = (**(code **)*puVar4)(puVar4);
        puVar4[1] = uVar9;
      }
      pNVar10 = (Node *)puVar4[1];
      if (pNVar10 != pNVar3) {
        do {
          pNVar10 = (Node *)pNVar10[8].Pair.Value;
          if (pNVar10 == pNVar3) break;
        } while (pNVar10 != (Node *)0x0);
        if (pNVar10 == (Node *)0x0) goto LAB_00420168;
      }
      bVar5 = false;
      bVar6 = true;
    }
    uVar12 = uVar12 + 1;
  } while (bVar5);
  if (!bVar6) {
    return false;
  }
  return true;
}

Assistant:

bool AActor::IsVisibleToPlayer() const
{
	// [BB] Safety check. This should never be NULL. Nevertheless, we return true to leave the default ZDoom behavior unaltered.
	if ( players[consoleplayer].camera == NULL )
		return true;
 
	if (VisibleToTeam != 0 && teamplay &&
		(signed)(VisibleToTeam-1) != players[consoleplayer].userinfo.GetTeam() )
		return false;

	const player_t* pPlayer = players[consoleplayer].camera->player;

	if (pPlayer && pPlayer->mo && GetClass()->VisibleToPlayerClass.Size() > 0)
	{
		bool visible = false;
		for(unsigned int i = 0;i < GetClass()->VisibleToPlayerClass.Size();++i)
		{
			PClassPlayerPawn *cls = GetClass()->VisibleToPlayerClass[i];
			if (cls && pPlayer->mo->GetClass()->IsDescendantOf(cls))
			{
				visible = true;
				break;
			}
		}
		if (!visible)
			return false;
	}

	// [BB] Passed all checks.
	return true;
}